

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O1

void __thiscall
fixedPreciseMeasurement_opsV2_Test::TestBody(fixedPreciseMeasurement_opsV2_Test *this)

{
  precise_unit *desired_units;
  double dVar1;
  unit uVar2;
  bool bVar3;
  unit_data uVar4;
  char *pcVar5;
  char *in_R9;
  pointer *__ptr;
  uint uVar6;
  pointer *__ptr_1;
  precise_unit pVar7;
  AssertionResult gtest_ar;
  fixed_precise_measurement spd;
  precise_measurement m3;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar__3;
  fixed_precise_measurement d2;
  fixed_precise_measurement d1;
  undefined1 local_e8 [8];
  unit local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_d8;
  unit local_c8;
  undefined1 local_c0 [8];
  unit local_b8;
  unit uStack_b0;
  undefined1 local_a8 [8];
  unit local_a0;
  unit uStack_98;
  undefined1 local_90 [8];
  unit local_88;
  unit uStack_80;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  AssertHelper local_60;
  undefined1 local_58 [16];
  unit uStack_48;
  AssertHelperData *local_40;
  undefined1 local_38 [8];
  unit uStack_30;
  
  local_40 = (AssertHelperData *)&DAT_4046800000000000;
  local_38 = (undefined1  [8])0x3ff0000000000000;
  uStack_30.multiplier_ = 1.4013e-45;
  uStack_30.base_units_ = (unit_data)0x0;
  local_58._0_8_ = &DAT_4053c00000000000;
  local_58._8_8_ = 0x3ff0000000000000;
  uStack_48.multiplier_ = 1.4013e-45;
  uStack_48.base_units_ = (unit_data)0x0;
  local_e8 = (undefined1  [8])0x3ff0000000000000;
  local_e0.multiplier_ = 1.4013e-45;
  local_e0.base_units_ = (unit_data)0x0;
  local_c8 = (unit)&DAT_3ff0000000000000;
  uVar4 = units::detail::unit_data::operator*((unit_data *)&uStack_30,(unit_data *)(local_e8 + 8));
  uVar6 = (uint)local_e0.base_units_ | (uint)uStack_30.base_units_;
  local_c0 = (undefined1  [8])&DAT_40abc60000000000;
  local_a8 = (undefined1  [8])&DAT_40abc60000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_e8,"area.value()","45.0 * 79",(double *)local_c0,(double *)local_a8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c0);
    if (local_e0 == (unit)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)local_e0)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2d1,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if (local_c0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c0 + 8))();
    }
  }
  if (local_e0 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_e8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
  }
  local_e8._0_4_ = local_c8.multiplier_;
  local_e8._4_4_ = local_c8.base_units_;
  local_e0 = (unit)CONCAT44(uVar6,uVar4);
  uVar4 = units::detail::unit_data::operator*
                    ((unit_data *)((long)&units::m + 4),(unit_data *)((long)&units::m + 4));
  local_a8 = (undefined1  [8])((ulong)(uint)uVar4 << 0x20 | 0x3f800000);
  bVar3 = units::precise_unit::operator==((precise_unit *)local_e8,(unit *)local_a8);
  local_c0[0] = bVar3;
  local_b8 = (unit)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_e8,(internal *)local_c0,(AssertionResult *)"area.units() == m * m",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2d2,(char *)local_e8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
    if (local_e8 != (undefined1  [8])&aStack_d8) {
      operator_delete((void *)local_e8,aStack_d8._M_allocated_capacity + 1);
    }
    if ((unit)local_a8 != (unit)0x0) {
      (**(code **)(*(long *)local_a8 + 8))();
    }
  }
  if (local_b8 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_c0 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
  }
  local_c8 = (unit)((double)local_58._0_8_ * (double)local_40);
  local_c0 = (undefined1  [8])local_58._8_8_;
  local_b8 = uStack_48;
  local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((double)local_58._8_8_ * (double)local_38);
  uVar4 = units::detail::unit_data::operator*((unit_data *)&uStack_30,(unit_data *)(local_c0 + 8));
  aStack_d8._M_allocated_capacity =
       CONCAT44((uint)local_b8.base_units_ | (uint)uStack_30.base_units_,uVar4);
  local_e8._0_4_ = local_c8.multiplier_;
  local_e8._4_4_ = local_c8.base_units_;
  local_e0 = (unit)local_68;
  local_c8 = (unit)((double)local_40 * (double)local_58._0_8_);
  local_a8 = local_38;
  local_a0 = uStack_30;
  local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((double)local_38 * (double)local_58._8_8_);
  uStack_b0.multiplier_ =
       units::detail::unit_data::operator*((unit_data *)&uStack_48,(unit_data *)(local_a8 + 8));
  uStack_b0.base_units_ = (unit_data)((uint)local_a0.base_units_ | (uint)uStack_48.base_units_);
  local_c0._0_4_ = local_c8.multiplier_;
  local_c0._4_4_ = local_c8.base_units_;
  local_b8 = (unit)local_68;
  bVar3 = units::precise_measurement::operator==
                    ((precise_measurement *)local_e8,(precise_measurement *)local_c0);
  local_90[0] = bVar3;
  local_88 = (unit)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_e8,(internal *)local_90,(AssertionResult *)"d1 * d2 == d2 * d1",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2d4,(char *)local_e8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if (local_e8 != (undefined1  [8])&aStack_d8) {
      operator_delete((void *)local_e8,aStack_d8._M_allocated_capacity + 1);
    }
    if (local_c0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c0 + 8))();
    }
  }
  desired_units = (precise_unit *)(local_58 + 8);
  if (local_88 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_90 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
  }
  local_e8 = (undefined1  [8])local_58._0_8_;
  local_e0.multiplier_ = (float)local_58._8_4_;
  local_e0.base_units_ = (unit_data)local_58._12_4_;
  aStack_d8._M_allocated_capacity._0_4_ = uStack_48.multiplier_;
  aStack_d8._M_allocated_capacity._4_4_ = uStack_48.base_units_;
  local_c8 = (unit)local_40;
  dVar1 = units::precise_measurement::value_as
                    ((precise_measurement *)local_e8,(precise_unit *)local_38);
  uVar2 = uStack_30;
  local_c0 = (undefined1  [8])(dVar1 + (double)local_c8);
  local_c8.multiplier_ = (float)local_38._0_4_;
  local_c8.base_units_ = (unit_data)local_38._4_4_;
  local_a8 = (undefined1  [8])&DAT_405f000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_e8,"sum.value()","45.0 + 79.0",(double *)local_c0,(double *)local_a8)
  ;
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c0);
    if (local_e0 == (unit)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_e0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2d7,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if (local_c0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c0 + 8))();
    }
  }
  if (local_e0 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_e8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
  }
  local_e8._0_4_ = local_c8.multiplier_;
  local_e8._4_4_ = local_c8.base_units_;
  local_e0 = uVar2;
  bVar3 = units::precise_unit::operator==((precise_unit *)local_e8,(unit *)&units::m);
  local_c0[0] = bVar3;
  local_b8 = (unit)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_e8,(internal *)local_c0,(AssertionResult *)"sum.units() == m","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2d8,(char *)local_e8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
    if (local_e8 != (undefined1  [8])&aStack_d8) {
      operator_delete((void *)local_e8,(ulong)(aStack_d8._M_allocated_capacity + 1));
    }
    if ((unit)local_a8 != (unit)0x0) {
      (**(code **)(*(long *)local_a8 + 8))();
    }
  }
  if (local_b8 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_c0 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
  }
  local_c0 = (undefined1  [8])local_58._0_8_;
  local_b8.multiplier_ = (float)local_58._8_4_;
  local_b8.base_units_ = (unit_data)local_58._12_4_;
  uStack_b0 = uStack_48;
  local_c8 = (unit)local_40;
  dVar1 = units::precise_measurement::value_as
                    ((precise_measurement *)local_c0,(precise_unit *)local_38);
  local_e8 = (undefined1  [8])(dVar1 + (double)local_c8);
  local_e0.multiplier_ = (float)local_38._0_4_;
  local_e0.base_units_ = (unit_data)local_38._4_4_;
  aStack_d8._M_allocated_capacity._0_4_ = uStack_30.multiplier_;
  aStack_d8._M_allocated_capacity._4_4_ = uStack_30.base_units_;
  local_90 = (undefined1  [8])local_40;
  local_88.multiplier_ = (float)local_38._0_4_;
  local_88.base_units_ = (unit_data)local_38._4_4_;
  uStack_80 = uStack_30;
  local_c8.multiplier_ = (float)local_58._0_4_;
  local_c8.base_units_ = (unit_data)local_58._4_4_;
  dVar1 = units::precise_measurement::value_as((precise_measurement *)local_90,desired_units);
  local_a8 = (undefined1  [8])(dVar1 + (double)local_c8);
  local_a0.multiplier_ = (float)local_58._8_4_;
  local_a0.base_units_ = (unit_data)local_58._12_4_;
  uStack_98 = uStack_48;
  bVar3 = units::fixed_precise_measurement::operator==
                    ((fixed_precise_measurement *)local_e8,(fixed_precise_measurement *)local_a8);
  local_78._M_head_impl._0_1_ = bVar3;
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_e8,(internal *)&local_78,(AssertionResult *)"d1 + d2 == d2 + d1",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2d9,(char *)local_e8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if (local_e8 != (undefined1  [8])&aStack_d8) {
      operator_delete((void *)local_e8,aStack_d8._M_allocated_capacity + 1);
    }
    if ((unit)local_c0 != (unit)0x0) {
      (**(code **)(*(size_type *)local_c0 + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_e8 = (undefined1  [8])local_40;
  local_e0.multiplier_ = (float)local_38._0_4_;
  local_e0.base_units_ = (unit_data)local_38._4_4_;
  aStack_d8._M_allocated_capacity._0_4_ = uStack_30.multiplier_;
  aStack_d8._M_allocated_capacity._4_4_ = uStack_30.base_units_;
  local_c8.multiplier_ = (float)local_58._0_4_;
  local_c8.base_units_ = (unit_data)local_58._4_4_;
  dVar1 = units::precise_measurement::value_as((precise_measurement *)local_e8,desired_units);
  uVar2 = uStack_48;
  local_c0 = (undefined1  [8])((double)local_c8 - dVar1);
  local_c8.multiplier_ = (float)local_58._8_4_;
  local_c8.base_units_ = (unit_data)local_58._12_4_;
  local_a8 = (undefined1  [8])&DAT_4041000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_e8,"diff.value()","79.0 - 45",(double *)local_c0,(double *)local_a8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c0);
    if (local_e0 == (unit)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_e0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2dc,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if (local_c0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c0 + 8))();
    }
  }
  if (local_e0 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_e8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
  }
  local_e8._0_4_ = local_c8.multiplier_;
  local_e8._4_4_ = local_c8.base_units_;
  local_e0 = uVar2;
  bVar3 = units::precise_unit::operator==((precise_unit *)local_e8,(unit *)&units::m);
  local_c0[0] = bVar3;
  local_b8 = (unit)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_e8,(internal *)local_c0,(AssertionResult *)"diff.units() == m",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2dd,(char *)local_e8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
    if (local_e8 != (undefined1  [8])&aStack_d8) {
      operator_delete((void *)local_e8,aStack_d8._M_allocated_capacity + 1);
    }
    if ((unit)local_a8 != (unit)0x0) {
      (**(code **)(*(long *)local_a8 + 8))();
    }
  }
  if (local_b8 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_c0 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
  }
  local_c8 = (unit)((double)local_40 / (double)local_58._0_8_);
  local_e8 = (undefined1  [8])local_58._8_8_;
  local_e0 = uStack_48;
  pVar7 = units::precise_unit::operator/((precise_unit *)local_38,(precise_unit *)local_e8);
  local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pVar7.multiplier_;
  local_c0._0_4_ = local_c8.multiplier_;
  local_c0._4_4_ = local_c8.base_units_;
  local_a8 = (undefined1  [8])&DAT_3fe23a5440cf6475;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_e8,"rat.value()","45.0 / 79",(double *)local_c0,(double *)local_a8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c0);
    if (local_e0 == (unit)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_e0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2e0,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if (local_c0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c0 + 8))();
    }
  }
  if (local_e0 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_e8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
  }
  local_e8 = (undefined1  [8])local_68;
  local_e0 = (unit)pVar7._8_8_;
  bVar3 = units::precise_unit::operator==((precise_unit *)local_e8,(unit *)&units::ratio);
  local_c0[0] = bVar3;
  local_b8 = (unit)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_e8,(internal *)local_c0,(AssertionResult *)"rat.units() == ratio",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2e1,(char *)local_e8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
    if (local_e8 != (undefined1  [8])&aStack_d8) {
      operator_delete((void *)local_e8,aStack_d8._M_allocated_capacity + 1);
    }
    if ((unit)local_a8 != (unit)0x0) {
      (**(code **)(*(long *)local_a8 + 8))();
    }
  }
  if (local_b8 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_c0 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
  }
  local_c8.multiplier_ = (float)local_58._0_4_;
  local_c8.base_units_ = (unit_data)local_58._4_4_;
  pVar7 = units::precise_unit::operator/(desired_units,(precise_unit *)units::precise::s);
  uStack_b0 = pVar7._8_8_;
  local_b8 = (unit)pVar7.multiplier_;
  local_c0._0_4_ = local_c8.multiplier_;
  local_c0._4_4_ = local_c8.base_units_;
  local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_b8;
  uStack_98.multiplier_ =
       units::detail::unit_data::operator*
                 ((unit_data *)&uStack_b0,(unit_data *)(units::precise::s + 8));
  uStack_98.base_units_ = (uint32_t)uStack_b0.base_units_;
  local_a8._0_4_ = local_c8.multiplier_;
  local_a8._4_4_ = local_c8.base_units_;
  local_a0 = (unit)local_68;
  bVar3 = units::fixed_precise_measurement::operator==
                    ((fixed_precise_measurement *)local_58,(precise_measurement *)local_a8);
  local_90[0] = bVar3;
  local_88 = (unit)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_e8,(internal *)local_90,(AssertionResult *)"d2 == m3","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2e7,(char *)local_e8);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_e8 != (undefined1  [8])&aStack_d8) {
      operator_delete((void *)local_e8,aStack_d8._M_allocated_capacity + 1);
    }
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
  }
  if (local_88 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_90 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
  }
  local_e8 = (undefined1  [8])local_58._0_8_;
  local_e0.multiplier_ = (float)local_58._8_4_;
  local_e0.base_units_ = (unit_data)local_58._12_4_;
  aStack_d8._M_allocated_capacity._0_4_ = uStack_48.multiplier_;
  aStack_d8._M_allocated_capacity._4_4_ = uStack_48.base_units_;
  bVar3 = units::precise_measurement::operator==
                    ((precise_measurement *)local_a8,(precise_measurement *)local_e8);
  local_90[0] = bVar3;
  local_88 = (unit)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_e8,(internal *)local_90,(AssertionResult *)"m3 == d2","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2e8,(char *)local_e8);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_e8 != (undefined1  [8])&aStack_d8) {
      operator_delete((void *)local_e8,(ulong)(aStack_d8._M_allocated_capacity + 1));
    }
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
  }
  if (local_88 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_90 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
  }
  local_90 = (undefined1  [8])&DAT_4010000000000000;
  local_78._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_4010000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_e8,"fm3.value()","4.0",(double *)local_90,(double *)&local_78);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_90);
    if (local_e0 == (unit)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_e0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2ec,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if (local_90 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_90 + 8))();
    }
  }
  if (local_e0 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_e8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
  }
  local_90 = (undefined1  [8])&DAT_3ff0000000000000;
  local_78._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3ff0000000000000
  ;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_e8,"fm3.value()","1.0",(double *)local_90,(double *)&local_78);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_90);
    if (local_e0 == (unit)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_e0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2ee,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if (local_90 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_90 + 8))();
    }
  }
  if (local_e0 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_e8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
  }
  local_90 = (undefined1  [8])&DAT_4000000000000000;
  local_78._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4000000000000000
  ;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_e8,"v.value()","2.0",(double *)local_90,(double *)&local_78);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_90);
    if (local_e0 == (unit)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_e0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2f1,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if (local_90 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_90 + 8))();
    }
  }
  if (local_e0 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_e8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
  }
  return;
}

Assistant:

TEST(fixedPreciseMeasurement, opsV2)
{
    fixed_precise_measurement d1(45.0, precise::m);
    fixed_precise_measurement d2(79, precise::m);

    auto area = d1 * d2;
    EXPECT_EQ(area.value(), 45.0 * 79);
    EXPECT_TRUE(area.units() == m * m);

    EXPECT_TRUE(d1 * d2 == d2 * d1);

    auto sum = d1 + d2;
    EXPECT_EQ(sum.value(), 45.0 + 79.0);
    EXPECT_TRUE(sum.units() == m);
    EXPECT_TRUE(d1 + d2 == d2 + d1);

    auto diff = d2 - d1;
    EXPECT_EQ(diff.value(), 79.0 - 45);
    EXPECT_TRUE(diff.units() == m);

    auto rat = d1 / d2;
    EXPECT_EQ(rat.value(), 45.0 / 79);
    EXPECT_TRUE(rat.units() == ratio);

    auto m1 = d2 / precise::s;
    fixed_precise_measurement spd(m1);
    auto m3 = spd * precise::s;

    EXPECT_TRUE(d2 == m3);
    EXPECT_TRUE(m3 == d2);

    fixed_precise_measurement fm3(2.0, precise::m);
    fm3 *= 2.0;
    EXPECT_EQ(fm3.value(), 4.0);
    fm3 /= 4.0;
    EXPECT_EQ(fm3.value(), 1.0);

    auto v = fm3 *= 2.0;
    EXPECT_EQ(v.value(), 2.0);
}